

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

PerThreadSynch *
absl::lts_20250127::DequeueAllWakeable
          (PerThreadSynch *head,PerThreadSynch *pw,PerThreadSynch **wake_tail)

{
  bool bVar1;
  byte bVar2;
  char *absl_raw_log_internal_basename;
  PerThreadSynch *pPStack_30;
  bool skipped;
  PerThreadSynch *w;
  PerThreadSynch *orig_h;
  PerThreadSynch **wake_tail_local;
  PerThreadSynch *pw_local;
  PerThreadSynch *head_local;
  
  pPStack_30 = pw->next;
  bVar2 = 0;
  orig_h = (PerThreadSynch *)wake_tail;
  wake_tail_local = &pw->next;
  pw_local = head;
  do {
    if ((pPStack_30->wake & 1U) == 0) {
      wake_tail_local = &Skip(pPStack_30)->next;
      bVar2 = 1;
    }
    else {
      if (wake_tail_local[1] != (PerThreadSynch *)0x0) {
        raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x443,"Check %s failed: %s","pw->skip == nullptr",
                   "bad skip in DequeueAllWakeable");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x443,
                      "PerThreadSynch *absl::DequeueAllWakeable(PerThreadSynch *, PerThreadSynch *, PerThreadSynch **)"
                     );
      }
      pw_local = Dequeue(pw_local,(PerThreadSynch *)wake_tail_local);
      pPStack_30->next = orig_h->next;
      orig_h->next = pPStack_30;
      orig_h = pPStack_30;
      if (pPStack_30->waitp->how == (MuHow)kExclusiveS) {
        return pw_local;
      }
    }
    pPStack_30 = *wake_tail_local;
    bVar1 = false;
    if ((head == pw_local) && (bVar1 = true, (PerThreadSynch *)wake_tail_local == pw_local)) {
      bVar1 = (bool)(bVar2 ^ 1);
    }
    if (!bVar1) {
      return pw_local;
    }
  } while( true );
}

Assistant:

static PerThreadSynch* DequeueAllWakeable(PerThreadSynch* head,
                                          PerThreadSynch* pw,
                                          PerThreadSynch** wake_tail) {
  PerThreadSynch* orig_h = head;
  PerThreadSynch* w = pw->next;
  bool skipped = false;
  do {
    if (w->wake) {  // remove this element
      ABSL_RAW_CHECK(pw->skip == nullptr, "bad skip in DequeueAllWakeable");
      // we're removing pw's successor so either pw->skip is zero or we should
      // already have removed pw since if pw->skip!=null, pw has the same
      // condition as w.
      head = Dequeue(head, pw);
      w->next = *wake_tail;               // keep list terminated
      *wake_tail = w;                     // add w to wake_list;
      wake_tail = &w->next;               // next addition to end
      if (w->waitp->how == kExclusive) {  // wake at most 1 writer
        break;
      }
    } else {         // not waking this one; skip
      pw = Skip(w);  // skip as much as possible
      skipped = true;
    }
    w = pw->next;
    // We want to stop processing after we've considered the original head,
    // orig_h.  We can't test for w==orig_h in the loop because w may skip over
    // it; we are guaranteed only that w's predecessor will not skip over
    // orig_h.  When we've considered orig_h, either we've processed it and
    // removed it (so orig_h != head), or we considered it and skipped it (so
    // skipped==true && pw == head because skipping from head always skips by
    // just one, leaving pw pointing at head).  So we want to
    // continue the loop with the negation of that expression.
  } while (orig_h == head && (pw != head || !skipped));
  return head;
}